

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

void destroy_context(Context_conflict2 *ctx)

{
  void *pvVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = ctx->free;
  pvVar1 = ctx->malloc_data;
  if (UNRECOVERED_JUMPTABLE == (MOJOSHADER_free)0x0) {
    UNRECOVERED_JUMPTABLE = MOJOSHADER_internal_free;
  }
  preprocessor_end(ctx->preprocessor);
  errorlist_destroy(ctx->errors);
  buffer_destroy(ctx->ctab);
  buffer_destroy(ctx->token_to_source);
  buffer_destroy(ctx->output);
  (*UNRECOVERED_JUMPTABLE)(ctx,pvVar1);
  return;
}

Assistant:

static void destroy_context(Context *ctx)
{
    if (ctx != NULL)
    {
        MOJOSHADER_free f = ((ctx->free != NULL) ? ctx->free : MOJOSHADER_internal_free);
        void *d = ctx->malloc_data;
        preprocessor_end(ctx->preprocessor);
        errorlist_destroy(ctx->errors);
        buffer_destroy(ctx->ctab);
        buffer_destroy(ctx->token_to_source);
        buffer_destroy(ctx->output);
        f(ctx, d);
    } // if
}